

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::FindKey
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Node *local_20;
  Node *n;
  THashTraits<int> Traits;
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *pTStack_10;
  int key_local;
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this_local;
  
  n._4_4_ = key;
  pTStack_10 = this;
  local_20 = MainPosition(this,key);
  while( true ) {
    bVar3 = false;
    if (local_20 != (Node *)0x0) {
      bVar1 = Node::IsNil(local_20);
      bVar3 = false;
      if (!bVar1) {
        iVar2 = THashTraits<int>::Compare
                          ((THashTraits<int> *)((long)&n + 3),(local_20->Pair).Key,n._4_4_);
        bVar3 = iVar2 != 0;
      }
    }
    if (!bVar3) break;
    local_20 = local_20->Next;
  }
  if ((local_20 != (Node *)0x0) && (bVar3 = Node::IsNil(local_20), !bVar3)) {
    return local_20;
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}